

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructBody
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t index,bool in_array)

{
  Type *type_00;
  StructDef *pSVar1;
  bool bVar2;
  reference ppFVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  ulong local_450;
  size_t i;
  size_t array_cnt;
  undefined1 local_420 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argname;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  undefined1 local_220 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_var;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Type *local_138;
  Type *field_type;
  FieldDef *field;
  undefined1 local_120 [8];
  const_reverse_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string indent;
  string *code;
  bool in_array_local;
  size_t index_local;
  char *nameprefix_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  CSharpGenerator *this_local;
  
  indent.field_2._8_8_ = code_ptr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,index * 2 + 2,' ',&local_61)
  ;
  std::allocator<char>::~allocator(&local_61);
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 "  builder.Prep(");
  std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  NumToString<unsigned_long>(&local_d8,struct_def->minalign);
  std::operator+(&local_b8,&local_d8,", ");
  std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  NumToString<unsigned_long>((string *)&it,struct_def->bytesize);
  std::operator+(&local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 ");\n");
  std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&it);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rbegin
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_120)
  ;
  code._7_1_ = in_array;
  while( true ) {
    std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::rend
              ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&field);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)local_120,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                             *)&field);
    if (!bVar2) break;
    ppFVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                           *)local_120);
    field_type = (Type *)*ppFVar3;
    local_138 = &(((FieldDef *)field_type)->value).type;
    if (((FieldDef *)field_type)->padding != 0) {
      std::operator+(&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "  builder.Pad(");
      std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      NumToString<unsigned_long>(&local_198,(unsigned_long)field_type[9].struct_def);
      std::operator+(&local_178,&local_198,");\n");
      std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
    }
    bVar2 = IsStruct(local_138);
    if (bVar2) {
      pSVar1 = local_138->struct_def;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_type
                     ,"_");
      std::operator+(&local_1b8,nameprefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      GenStructBody(this,pSVar1,code_ptr,pcVar4,index,(bool)(code._7_1_ & 1));
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&type);
    }
    else {
      bVar2 = IsArray(local_138);
      if (bVar2) {
        Type::VectorType((Type *)((long)&index_var.field_2 + 8),local_138);
      }
      else {
        index_var.field_2._8_4_ = local_138->base_type;
        index_var.field_2._12_4_ = local_138->element;
      }
      type_00 = (Type *)(&index_var.field_2._M_allocated_capacity + 1);
      NumToString<unsigned_long>(&local_240,index);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     "_idx",&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      bVar2 = IsArray(local_138);
      if (bVar2) {
        std::operator+(&local_2a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,"  for (int ");
        std::operator+(&local_280,&local_2a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220);
        std::operator+(&local_260,&local_280," = ");
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_2a0);
        NumToString<unsigned_short>(&local_2c0,local_138->fixed_length);
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::operator+(&local_340,"; ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220);
        std::operator+(&local_320,&local_340," > 0; ");
        std::operator+(&local_300,&local_320,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220);
        std::operator+(&local_2e0,&local_300,"--) {\n");
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        code._7_1_ = 1;
      }
      bVar2 = IsStruct(type_00);
      if (bVar2) {
        pSVar1 = local_138->struct_def;
        std::operator+(&local_380,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       field_type,"_");
        std::operator+(&local_360,nameprefix,&local_380);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        GenStructBody(this,pSVar1,code_ptr,pcVar4,index + 1,(bool)(code._7_1_ & 1));
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
      }
      else {
        bVar2 = IsArray(local_138);
        pcVar4 = "";
        if (bVar2) {
          pcVar4 = "  ";
        }
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,pcVar4);
        std::operator+(&local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,"  builder.Put");
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
        GenMethod_abi_cxx11_(&local_3e0,this,type_00);
        std::operator+(&local_3c0,&local_3e0,"(");
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3e0);
        SourceCast_abi_cxx11_((string *)((long)&argname.field_2 + 8),this,type_00,false);
        std::__cxx11::string::operator+=
                  ((string *)indent.field_2._8_8_,(string *)(argname.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(argname.field_2._M_local_buf + 8));
        Name_abi_cxx11_((string *)&array_cnt,this,(FieldDef *)field_type);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_420,nameprefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_cnt);
        std::__cxx11::string::~string((string *)&array_cnt);
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)local_420);
        bVar2 = IsArray(local_138);
        i = index + (long)(int)(uint)bVar2;
        if (i != 0) {
          std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,"[");
          for (local_450 = 0; (code._7_1_ & 1) != 0 && local_450 < i; local_450 = local_450 + 1) {
            NumToString<unsigned_long>(&local_4b0,local_450);
            std::operator+(&local_490,"_idx",&local_4b0);
            std::operator+(&local_470,&local_490,"-1");
            std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_470);
            std::__cxx11::string::~string((string *)&local_470);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_4b0);
            if (local_450 != i - 1) {
              std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,",");
            }
          }
          std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,"]");
        }
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,");\n");
        std::__cxx11::string::~string((string *)local_420);
      }
      bVar2 = IsArray(local_138);
      if (bVar2) {
        std::operator+(&local_4d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,"  }\n");
        std::__cxx11::string::operator+=((string *)indent.field_2._8_8_,(string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4d0);
      }
      std::__cxx11::string::~string((string *)local_220);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>_>
                  *)local_120);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t index = 0,
                     bool in_array = false) const {
    std::string &code = *code_ptr;
    std::string indent((index + 1) * 2, ' ');
    code += indent + "  builder.Prep(";
    code += NumToString(struct_def.minalign) + ", ";
    code += NumToString(struct_def.bytesize) + ");\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field.padding) {
        code += indent + "  builder.Pad(";
        code += NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field_type)) {
        GenStructBody(*field_type.struct_def, code_ptr,
                      (nameprefix + (field.name + "_")).c_str(), index,
                      in_array);
      } else {
        const auto &type =
            IsArray(field_type) ? field_type.VectorType() : field_type;
        const auto index_var = "_idx" + NumToString(index);
        if (IsArray(field_type)) {
          code += indent + "  for (int " + index_var + " = ";
          code += NumToString(field_type.fixed_length);
          code += "; " + index_var + " > 0; " + index_var + "--) {\n";
          in_array = true;
        }
        if (IsStruct(type)) {
          GenStructBody(*field_type.struct_def, code_ptr,
                        (nameprefix + (field.name + "_")).c_str(), index + 1,
                        in_array);
        } else {
          code += IsArray(field_type) ? "  " : "";
          code += indent + "  builder.Put";
          code += GenMethod(type) + "(";
          code += SourceCast(type);
          auto argname = nameprefix + Name(field);
          code += argname;
          size_t array_cnt = index + (IsArray(field_type) ? 1 : 0);
          if (array_cnt > 0) {
            code += "[";
            for (size_t i = 0; in_array && i < array_cnt; i++) {
              code += "_idx" + NumToString(i) + "-1";
              if (i != (array_cnt - 1)) code += ",";
            }
            code += "]";
          }
          code += ");\n";
        }
        if (IsArray(field_type)) { code += indent + "  }\n"; }
      }
    }
  }